

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestBuildHandler.cxx
# Opt level: O2

int __thiscall cmCTestBuildHandler::ProcessSingleLine(cmCTestBuildHandler *this,char *data)

{
  cmCTest *pcVar1;
  pointer pRVar2;
  pointer pRVar3;
  bool bVar4;
  int iVar5;
  ostream *poVar6;
  int iVar7;
  long lVar8;
  pointer pRVar9;
  pointer this_00;
  bool bVar10;
  char *local_208 [4];
  string line;
  string input;
  ostringstream cmCTestLog_msg;
  
  if (this->UseCTestLaunch != false) {
    return 0;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&input,data,(allocator<char> *)&cmCTestLog_msg);
  line._M_dataplus._M_p = (pointer)&line.field_2;
  line._M_string_length = 0;
  line.field_2._M_local_buf[0] = '\0';
  cmStringReplaceHelper::Replace(this->ColorRemover,&input,&line);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
  poVar6 = std::operator<<((ostream *)&cmCTestLog_msg,"Line: [");
  poVar6 = std::operator<<(poVar6,(string *)&line);
  poVar6 = std::operator<<(poVar6,"]");
  std::endl<char,std::char_traits<char>>(poVar6);
  pcVar1 = (this->super_cmCTestGenericHandler).CTest;
  std::__cxx11::stringbuf::str();
  cmCTest::Log(pcVar1,0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmCTestBuildHandler.cxx"
               ,0x477,local_208[0],(this->super_cmCTestGenericHandler).Quiet);
  std::__cxx11::string::~string((string *)local_208);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
  bVar10 = true;
  if (this->ErrorQuotaReached == false) {
    pRVar2 = (this->ErrorMatchRegex).
             super__Vector_base<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    lVar8 = 0;
    for (pRVar9 = (this->ErrorMatchRegex).
                  super__Vector_base<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>
                  ._M_impl.super__Vector_impl_data._M_start; bVar10 = pRVar9 == pRVar2, !bVar10;
        pRVar9 = pRVar9 + 1) {
      bVar4 = cmsys::RegularExpression::find(pRVar9,line._M_dataplus._M_p);
      if (bVar4) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
        poVar6 = std::operator<<((ostream *)&cmCTestLog_msg,"  Error Line: ");
        poVar6 = std::operator<<(poVar6,(string *)&line);
        poVar6 = std::operator<<(poVar6," (matches: ");
        poVar6 = std::operator<<(poVar6,(string *)
                                        ((long)(this->CustomErrorMatches).
                                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                               ._M_impl.super__Vector_impl_data._M_start - lVar8));
        poVar6 = std::operator<<(poVar6,")");
        std::endl<char,std::char_traits<char>>(poVar6);
        pcVar1 = (this->super_cmCTestGenericHandler).CTest;
        std::__cxx11::stringbuf::str();
        cmCTest::Log(pcVar1,0,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmCTestBuildHandler.cxx"
                     ,0x488,local_208[0],(this->super_cmCTestGenericHandler).Quiet);
        std::__cxx11::string::~string((string *)local_208);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
        break;
      }
      lVar8 = lVar8 + -0x20;
    }
    pRVar2 = (this->ErrorExceptionRegex).
             super__Vector_base<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    lVar8 = 0;
    for (pRVar9 = (this->ErrorExceptionRegex).
                  super__Vector_base<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>
                  ._M_impl.super__Vector_impl_data._M_start; pRVar9 != pRVar2; pRVar9 = pRVar9 + 1)
    {
      bVar4 = cmsys::RegularExpression::find(pRVar9,line._M_dataplus._M_p);
      if (bVar4) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
        poVar6 = std::operator<<((ostream *)&cmCTestLog_msg,"  Not an error Line: ");
        poVar6 = std::operator<<(poVar6,(string *)&line);
        poVar6 = std::operator<<(poVar6," (matches: ");
        poVar6 = std::operator<<(poVar6,(string *)
                                        ((long)(this->CustomErrorExceptions).
                                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                               ._M_impl.super__Vector_impl_data._M_start - lVar8));
        poVar6 = std::operator<<(poVar6,")");
        std::endl<char,std::char_traits<char>>(poVar6);
        pcVar1 = (this->super_cmCTestGenericHandler).CTest;
        std::__cxx11::stringbuf::str();
        cmCTest::Log(pcVar1,0,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmCTestBuildHandler.cxx"
                     ,0x497,local_208[0],(this->super_cmCTestGenericHandler).Quiet);
        std::__cxx11::string::~string((string *)local_208);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
        bVar10 = true;
        break;
      }
      lVar8 = lVar8 + -0x20;
    }
  }
  if (this->WarningQuotaReached == false) {
    pRVar2 = (this->WarningMatchRegex).
             super__Vector_base<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    lVar8 = 0;
    for (pRVar9 = (this->WarningMatchRegex).
                  super__Vector_base<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>
                  ._M_impl.super__Vector_impl_data._M_start; pRVar9 != pRVar2; pRVar9 = pRVar9 + 1)
    {
      bVar4 = cmsys::RegularExpression::find(pRVar9,line._M_dataplus._M_p);
      if (bVar4) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
        poVar6 = std::operator<<((ostream *)&cmCTestLog_msg,"  Warning Line: ");
        poVar6 = std::operator<<(poVar6,(string *)&line);
        poVar6 = std::operator<<(poVar6," (matches: ");
        poVar6 = std::operator<<(poVar6,(string *)
                                        ((long)(this->CustomWarningMatches).
                                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                               ._M_impl.super__Vector_impl_data._M_start - lVar8));
        poVar6 = std::operator<<(poVar6,")");
        std::endl<char,std::char_traits<char>>(poVar6);
        pcVar1 = (this->super_cmCTestGenericHandler).CTest;
        std::__cxx11::stringbuf::str();
        cmCTest::Log(pcVar1,0,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmCTestBuildHandler.cxx"
                     ,0x4a8,local_208[0],(this->super_cmCTestGenericHandler).Quiet);
        std::__cxx11::string::~string((string *)local_208);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
        break;
      }
      lVar8 = lVar8 + -0x20;
    }
    pRVar3 = (this->WarningExceptionRegex).
             super__Vector_base<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    lVar8 = 0;
    for (this_00 = (this->WarningExceptionRegex).
                   super__Vector_base<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>
                   ._M_impl.super__Vector_impl_data._M_start; this_00 != pRVar3;
        this_00 = this_00 + 1) {
      bVar4 = cmsys::RegularExpression::find(this_00,line._M_dataplus._M_p);
      if (bVar4) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
        poVar6 = std::operator<<((ostream *)&cmCTestLog_msg,"  Not a warning Line: ");
        poVar6 = std::operator<<(poVar6,(string *)&line);
        poVar6 = std::operator<<(poVar6," (matches: ");
        poVar6 = std::operator<<(poVar6,(string *)
                                        ((long)(this->CustomWarningExceptions).
                                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                               ._M_impl.super__Vector_impl_data._M_start - lVar8));
        poVar6 = std::operator<<(poVar6,")");
        std::endl<char,std::char_traits<char>>(poVar6);
        pcVar1 = (this->super_cmCTestGenericHandler).CTest;
        std::__cxx11::stringbuf::str();
        cmCTest::Log(pcVar1,0,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmCTestBuildHandler.cxx"
                     ,0x4b8,local_208[0],(this->super_cmCTestGenericHandler).Quiet);
        std::__cxx11::string::~string((string *)local_208);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
        goto LAB_001a32e3;
      }
      lVar8 = lVar8 + -0x20;
    }
    if (pRVar9 != pRVar2) {
      iVar5 = 1;
      goto LAB_001a32e5;
    }
  }
LAB_001a32e3:
  iVar5 = 0;
LAB_001a32e5:
  iVar7 = 2;
  if (bVar10) {
    iVar7 = iVar5;
  }
  std::__cxx11::string::~string((string *)&line);
  std::__cxx11::string::~string((string *)&input);
  return iVar7;
}

Assistant:

int cmCTestBuildHandler::ProcessSingleLine(const char* data)
{
  if (this->UseCTestLaunch) {
    // No log scraping when using launchers.
    return b_REGULAR_LINE;
  }

  // Ignore ANSI color codes when checking for errors and warnings.
  std::string input(data);
  std::string line;
  this->ColorRemover->Replace(input, line);

  cmCTestOptionalLog(this->CTest, DEBUG, "Line: [" << line << "]" << std::endl,
                     this->Quiet);

  int warningLine = 0;
  int errorLine = 0;

  // Check for regular expressions

  if (!this->ErrorQuotaReached) {
    // Errors
    int wrxCnt = 0;
    for (cmsys::RegularExpression& rx : this->ErrorMatchRegex) {
      if (rx.find(line.c_str())) {
        errorLine = 1;
        cmCTestOptionalLog(this->CTest, DEBUG,
                           "  Error Line: " << line << " (matches: "
                                            << this->CustomErrorMatches[wrxCnt]
                                            << ")" << std::endl,
                           this->Quiet);
        break;
      }
      wrxCnt++;
    }
    // Error exceptions
    wrxCnt = 0;
    for (cmsys::RegularExpression& rx : this->ErrorExceptionRegex) {
      if (rx.find(line.c_str())) {
        errorLine = 0;
        cmCTestOptionalLog(this->CTest, DEBUG,
                           "  Not an error Line: "
                             << line << " (matches: "
                             << this->CustomErrorExceptions[wrxCnt] << ")"
                             << std::endl,
                           this->Quiet);
        break;
      }
      wrxCnt++;
    }
  }
  if (!this->WarningQuotaReached) {
    // Warnings
    int wrxCnt = 0;
    for (cmsys::RegularExpression& rx : this->WarningMatchRegex) {
      if (rx.find(line.c_str())) {
        warningLine = 1;
        cmCTestOptionalLog(this->CTest, DEBUG,
                           "  Warning Line: "
                             << line << " (matches: "
                             << this->CustomWarningMatches[wrxCnt] << ")"
                             << std::endl,
                           this->Quiet);
        break;
      }
      wrxCnt++;
    }

    wrxCnt = 0;
    // Warning exceptions
    for (cmsys::RegularExpression& rx : this->WarningExceptionRegex) {
      if (rx.find(line.c_str())) {
        warningLine = 0;
        cmCTestOptionalLog(this->CTest, DEBUG,
                           "  Not a warning Line: "
                             << line << " (matches: "
                             << this->CustomWarningExceptions[wrxCnt] << ")"
                             << std::endl,
                           this->Quiet);
        break;
      }
      wrxCnt++;
    }
  }
  if (errorLine) {
    return b_ERROR_LINE;
  }
  if (warningLine) {
    return b_WARNING_LINE;
  }
  return b_REGULAR_LINE;
}